

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

int drmp3_hdr_frame_bytes(drmp3_uint8 *h,int free_format_size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = h[1];
  uVar3 = 0x180;
  if ((~bVar1 & 6) != 0) {
    uVar3 = 0x480 >> ((bVar1 & 0xe) == 2);
  }
  uVar2 = bVar1 >> 3 & 1;
  uVar3 = ((byte)drmp3_hdr_bitrate_kbps_halfrate
                 [(ulong)(h[2] >> 4) + (long)(int)((bVar1 >> 1 & 3) - 1) * 0xf + (ulong)uVar2 * 0x2d
                 ] * uVar3 * 0xfa) /
          ((*(uint *)(drmp3_hdr_sample_rate_hz_g_hz + (h[2] & 0xc)) >> ((byte)uVar2 ^ 1)) >>
          ((bVar1 & 0x10) == 0));
  if ((~bVar1 & 6) == 0) {
    uVar3 = uVar3 & 0x7fffffc;
  }
  if (uVar3 == 0) {
    uVar3 = free_format_size;
  }
  return uVar3;
}

Assistant:

static int drmp3_hdr_frame_bytes(const drmp3_uint8 *h, int free_format_size)
{
    int frame_bytes = drmp3_hdr_frame_samples(h)*drmp3_hdr_bitrate_kbps(h)*125/drmp3_hdr_sample_rate_hz(h);
    if (DRMP3_HDR_IS_LAYER_1(h))
    {
        frame_bytes &= ~3; /* slot align */
    }
    return frame_bytes ? frame_bytes : free_format_size;
}